

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

aiNode * __thiscall Assimp::BVHLoader::ReadNode(BVHLoader *this)

{
  pointer __src;
  bool bVar1;
  aiNode *this_00;
  aiNode **__dest;
  ulong __n;
  vector<aiNode_*,_std::allocator<aiNode_*>_> childNodes;
  string siteToken;
  string openBrace;
  string nodeName;
  string token;
  aiNode *child;
  _Vector_base<aiNode_*,_std::allocator<aiNode_*>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  pointer local_230;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [32];
  pointer pfStack_188;
  pointer local_180;
  pointer pfStack_178;
  
  GetNextToken_abi_cxx11_(&local_208,this);
  if (local_208._M_string_length != 0) {
    bVar1 = std::operator==(&local_208,"{");
    if (!bVar1) {
      GetNextToken_abi_cxx11_(&local_228,this);
      bVar1 = std::operator!=(&local_228,"{");
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::operator<<((ostream *)local_1a8,"Expected opening brace \"{\", but found \"");
        std::operator<<((ostream *)local_1a8,(string *)&local_228);
        std::operator<<((ostream *)local_1a8,"\".");
        std::__cxx11::stringbuf::str();
        ThrowException(this,&local_250);
      }
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00,&local_208);
      local_268._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_268._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8._8_8_ = (pointer)0x0;
      local_1a8._16_8_ = (pointer)0x0;
      local_1a8._24_8_ = (pointer)0x0;
      pfStack_188 = (pointer)0x0;
      local_180 = (pointer)0x0;
      pfStack_178 = (pointer)0x0;
      local_1a8._0_8_ = this_00;
      std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::
      emplace_back<Assimp::BVHLoader::Node>(&this->mNodes,(Node *)local_1a8);
      Node::~Node((Node *)local_1a8);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      local_250._M_string_length = 0;
      local_230 = (this->mNodes).
                  super__Vector_base<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_250.field_2._M_local_buf[0] = '\0';
      do {
        GetNextToken_abi_cxx11_(&local_1c8,this);
        bVar1 = std::operator==(&local_1c8,"OFFSET");
        if (bVar1) {
          ReadNodeOffset(this,this_00);
        }
        else {
          bVar1 = std::operator==(&local_1c8,"CHANNELS");
          if (bVar1) {
            ReadNodeChannels(this,local_230);
          }
          else {
            bVar1 = std::operator==(&local_1c8,"JOINT");
            if (bVar1) {
              local_1a8._0_8_ = ReadNode(this);
              ((aiNode *)local_1a8._0_8_)->mParent = this_00;
              std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&local_268,
                         (value_type *)local_1a8);
            }
            else {
              bVar1 = std::operator==(&local_1c8,"End");
              if (!bVar1) {
                bVar1 = std::operator==(&local_1c8,"}");
                if (bVar1) {
                  std::__cxx11::string::~string((string *)&local_1c8);
                  __src = local_268._M_impl.super__Vector_impl_data._M_start;
                  __n = (long)local_268._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_268._M_impl.super__Vector_impl_data._M_start;
                  if (__n != 0) {
                    this_00->mNumChildren = (uint)(__n >> 3);
                    __dest = (aiNode **)operator_new__(__n & 0x7fffffff8);
                    this_00->mChildren = __dest;
                    memmove(__dest,__src,__n);
                  }
                  std::__cxx11::string::~string((string *)&local_250);
                  std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base(&local_268);
                  std::__cxx11::string::~string((string *)&local_228);
                  std::__cxx11::string::~string((string *)&local_208);
                  return this_00;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::operator<<((ostream *)local_1a8,"Unknown keyword \"");
                std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
                std::operator<<((ostream *)local_1a8,"\".");
                std::__cxx11::stringbuf::str();
                ThrowException(this,&local_1e8);
              }
              local_250._M_string_length = 0;
              *local_250._M_dataplus._M_p = '\0';
              GetNextToken_abi_cxx11_((string *)local_1a8,this);
              std::__cxx11::string::operator=((string *)&local_250,(string *)local_1a8);
              std::__cxx11::string::~string((string *)local_1a8);
              bVar1 = std::operator!=(&local_250,"Site");
              if (bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::operator<<((ostream *)local_1a8,"Expected \"End Site\" keyword, but found \"");
                std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
                std::operator<<((ostream *)local_1a8," ");
                std::operator<<((ostream *)local_1a8,(string *)&local_250);
                std::operator<<((ostream *)local_1a8,"\".");
                std::__cxx11::stringbuf::str();
                ThrowException(this,&local_1e8);
              }
              local_1a8._0_8_ = ReadEndSite(this,&local_208);
              ((aiNode *)local_1a8._0_8_)->mParent = this_00;
              std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&local_268,
                         (value_type *)local_1a8);
            }
          }
        }
        std::__cxx11::string::~string((string *)&local_1c8);
      } while( true );
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"Expected node name, but found \"");
  std::operator<<((ostream *)local_1a8,(string *)&local_208);
  std::operator<<((ostream *)local_1a8,"\".");
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_228);
}

Assistant:

aiNode* BVHLoader::ReadNode()
{
    // first token is name
    std::string nodeName = GetNextToken();
    if( nodeName.empty() || nodeName == "{")
        ThrowException( format() << "Expected node name, but found \"" << nodeName << "\"." );

    // then an opening brace should follow
    std::string openBrace = GetNextToken();
    if( openBrace != "{")
        ThrowException( format() << "Expected opening brace \"{\", but found \"" << openBrace << "\"." );

    // Create a node
    aiNode* node = new aiNode( nodeName);
    std::vector<aiNode*> childNodes;

    // and create an bone entry for it
    mNodes.push_back( Node( node));
    Node& internNode = mNodes.back();

    // now read the node's contents
    std::string siteToken;
    while( 1)
    {
        std::string token = GetNextToken();

        // node offset to parent node
        if( token == "OFFSET")
            ReadNodeOffset( node);
        else if( token == "CHANNELS")
            ReadNodeChannels( internNode);
        else if( token == "JOINT")
        {
            // child node follows
            aiNode* child = ReadNode();
            child->mParent = node;
            childNodes.push_back( child);
        }
        else if( token == "End")
        {
            // The real symbol is "End Site". Second part comes in a separate token
            siteToken.clear();
            siteToken = GetNextToken();
            if( siteToken != "Site")
                ThrowException( format() << "Expected \"End Site\" keyword, but found \"" << token << " " << siteToken << "\"." );

            aiNode* child = ReadEndSite( nodeName);
            child->mParent = node;
            childNodes.push_back( child);
        }
        else if( token == "}")
        {
            // we're done with that part of the hierarchy
            break;
        } else
        {
            // everything else is a parse error
            ThrowException( format() << "Unknown keyword \"" << token << "\"." );
        }
    }

    // add the child nodes if there are any
    if( childNodes.size() > 0)
    {
        node->mNumChildren = static_cast<unsigned int>(childNodes.size());
        node->mChildren = new aiNode*[node->mNumChildren];
        std::copy( childNodes.begin(), childNodes.end(), node->mChildren);
    }

    // and return the sub-hierarchy we built here
    return node;
}